

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O0

void __thiscall LUPMatrix::LUPMatrix(LUPMatrix *this,ExtendedMatrix *system)

{
  Matrix *pMVar1;
  Permutation *row_permutation;
  Permutation *column_permutation;
  Matrix local_58;
  Matrix local_38;
  ExtendedMatrix *local_18;
  ExtendedMatrix *system_local;
  LUPMatrix *this_local;
  
  local_18 = system;
  system_local = (ExtendedMatrix *)this;
  pMVar1 = ExtendedMatrix::GetExtensionMatrix(system);
  Matrix::GetInverse(&local_38,pMVar1,Without);
  pMVar1 = ExtendedMatrix::GetMainMatrix(local_18);
  Matrix::Matrix(&local_58,pMVar1);
  row_permutation = ExtendedMatrix::GetRowPermutation(local_18);
  column_permutation = ExtendedMatrix::GetMainColumnPermutation(local_18);
  LUPMatrix(this,&local_38,&local_58,row_permutation,column_permutation);
  Matrix::~Matrix(&local_58);
  Matrix::~Matrix(&local_38);
  return;
}

Assistant:

LUPMatrix::LUPMatrix(const ExtendedMatrix& system)
  : LUPMatrix(system.GetExtensionMatrix().GetInverse(Options::ChoiceType::Without), system.GetMainMatrix(),
              system.GetRowPermutation(), system.GetMainColumnPermutation()) {}